

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::MessageDifferencer::IsIgnored
          (MessageDifferencer *this,Message *message1,Message *message2,FieldDescriptor *field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  pointer ppIVar5;
  ulong uVar6;
  
  p_Var3 = (this->ignored_fields_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->ignored_fields_)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      if (*(FieldDescriptor **)(p_Var3 + 1) >= field) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(FieldDescriptor **)(p_Var3 + 1) < field];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && (*(FieldDescriptor **)(p_Var4 + 1) <= field)) {
      return true;
    }
  }
  ppIVar5 = (this->ignore_criteria_).
            super__Vector_base<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::allocator<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->ignore_criteria_).
      super__Vector_base<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::allocator<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppIVar5) {
    uVar6 = 0;
    do {
      iVar2 = (*ppIVar5[uVar6]->_vptr_IgnoreCriteria[2])
                        (ppIVar5[uVar6],message1,message2,field,parent_fields);
      if ((char)iVar2 != '\0') {
        return (bool)(char)iVar2;
      }
      uVar6 = uVar6 + 1;
      ppIVar5 = (this->ignore_criteria_).
                super__Vector_base<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::allocator<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->ignore_criteria_).
                                   super__Vector_base<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::allocator<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar5 >> 3))
    ;
  }
  return false;
}

Assistant:

bool MessageDifferencer::IsIgnored(
    const Message& message1, const Message& message2,
    const FieldDescriptor* field,
    const std::vector<SpecificField>& parent_fields) {
  if (ignored_fields_.find(field) != ignored_fields_.end()) {
    return true;
  }
  for (int i = 0; i < ignore_criteria_.size(); ++i) {
    if (ignore_criteria_[i]->IsIgnored(message1, message2, field,
                                       parent_fields)) {
      return true;
    }
  }
  return false;
}